

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderResourceVariableBase.hpp
# Opt level: O2

bool Diligent::VerifyResourceBinding<Diligent::BufferViewGLImpl>
               (char *ExpectedResourceTypeName,PipelineResourceDesc *ResDesc,
               BindResourceInfo *BindInfo,BufferViewGLImpl *pResourceImpl,
               IDeviceObject *pCachedObject,char *SignatureName)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  Char *pCVar3;
  undefined4 extraout_var_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args_00;
  char *pcVar4;
  string msg;
  Diligent local_1d8 [32];
  stringstream ss;
  ostream local_1a8 [376];
  
  if ((pResourceImpl == (BufferViewGLImpl *)0x0) && (BindInfo->pObject != (IDeviceObject *)0x0)) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    poVar2 = std::operator<<(local_1a8,"Failed to bind object \'");
    iVar1 = (*(BindInfo->pObject->super_IObject)._vptr_IObject[4])();
    poVar2 = std::operator<<(poVar2,*(char **)CONCAT44(extraout_var,iVar1));
    poVar2 = std::operator<<(poVar2,"\' to variable \'");
    GetShaderResourcePrintName<Diligent::PipelineResourceDesc>(&msg,ResDesc,BindInfo->ArrayIndex);
    poVar2 = std::operator<<(poVar2,(string *)&msg);
    std::operator<<(poVar2,'\'');
    std::__cxx11::string::~string((string *)&msg);
    if (SignatureName != (char *)0x0) {
      poVar2 = std::operator<<(local_1a8," defined by signature \'");
      poVar2 = std::operator<<(poVar2,SignatureName);
      std::operator<<(poVar2,'\'');
    }
    poVar2 = std::operator<<(local_1a8,". Invalid resource type: ");
    poVar2 = std::operator<<(poVar2,ExpectedResourceTypeName);
    std::operator<<(poVar2," is expected.");
    std::__cxx11::stringbuf::str();
    FormatString<std::__cxx11::string>(&msg,local_1d8,Args);
    std::__cxx11::string::~string((string *)local_1d8);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"VerifyResourceBinding",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
               ,0xb1);
    goto LAB_002e40e5;
  }
  if (ResDesc->VarType == SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC) {
    return true;
  }
  if ((BufferViewGLImpl *)pCachedObject == pResourceImpl) {
    return true;
  }
  if (pCachedObject == (IDeviceObject *)0x0) {
    return true;
  }
  if ((BindInfo->Flags & SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE) != SET_SHADER_RESOURCE_FLAG_NONE)
  {
    return true;
  }
  pCVar3 = GetShaderVariableTypeLiteralName(ResDesc->VarType,false);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_1a8,"Non-null ");
  poVar2 = std::operator<<(poVar2,ExpectedResourceTypeName);
  poVar2 = std::operator<<(poVar2," \'");
  iVar1 = (*(pCachedObject->super_IObject)._vptr_IObject[4])(pCachedObject);
  poVar2 = std::operator<<(poVar2,*(char **)CONCAT44(extraout_var_00,iVar1));
  poVar2 = std::operator<<(poVar2,"\' is already bound to ");
  poVar2 = std::operator<<(poVar2,pCVar3);
  poVar2 = std::operator<<(poVar2," shader variable \'");
  GetShaderResourcePrintName<Diligent::PipelineResourceDesc>(&msg,ResDesc,BindInfo->ArrayIndex);
  poVar2 = std::operator<<(poVar2,(string *)&msg);
  std::operator<<(poVar2,'\'');
  std::__cxx11::string::~string((string *)&msg);
  if (SignatureName != (char *)0x0) {
    poVar2 = std::operator<<(local_1a8," defined by signature \'");
    poVar2 = std::operator<<(poVar2,SignatureName);
    std::operator<<(poVar2,'\'');
  }
  std::operator<<(local_1a8,". Overwriting the binding with ");
  if (pResourceImpl == (BufferViewGLImpl *)0x0) {
    pcVar4 = "null";
    poVar2 = local_1a8;
  }
  else {
    poVar2 = std::operator<<(local_1a8,"another resource (\'");
    poVar2 = std::operator<<(poVar2,(pResourceImpl->
                                    super_BufferViewBase<Diligent::EngineGLImplTraits>).
                                    super_DeviceObjectBase<Diligent::IBufferViewGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferViewDesc>
                                    .m_Desc.super_DeviceObjectAttribs.Name);
    pcVar4 = "\')";
  }
  std::operator<<(poVar2,pcVar4);
  std::operator<<(local_1a8," is disallowed by default.");
  if (ResDesc->VarType == SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE) {
    poVar2 = std::operator<<(local_1a8,
                             " If this is intended and you ensured proper synchronization, use the SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE flag. Otherwise,"
                            );
    pcVar4 = " use another shader resource binding instance or label the variable as dynamic.";
LAB_002e42b3:
    std::operator<<(poVar2,pcVar4);
  }
  else if (ResDesc->VarType == SHADER_RESOURCE_VARIABLE_TYPE_STATIC) {
    poVar2 = std::operator<<(local_1a8,
                             " If this is intended, use the SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE flag. Otherwise,"
                            );
    pcVar4 = 
    " label the variable as mutable and use another shader resource binding instance, or label the variable as dynamic."
    ;
    goto LAB_002e42b3;
  }
  std::__cxx11::stringbuf::str();
  FormatString<std::__cxx11::string>(&msg,local_1d8,Args_00);
  std::__cxx11::string::~string((string *)local_1d8);
  DebugAssertionFailed
            (msg._M_dataplus._M_p,"VerifyResourceBinding",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/ShaderResourceVariableBase.hpp"
             ,0xd9);
LAB_002e40e5:
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return false;
}

Assistant:

bool VerifyResourceBinding(const char*                 ExpectedResourceTypeName,
                           const PipelineResourceDesc& ResDesc,
                           const BindResourceInfo&     BindInfo,
                           const ResourceImplType*     pResourceImpl, // Expected resource implementation
                           const IDeviceObject*        pCachedObject, // Object already set in the cache
                           const char*                 SignatureName)
{
    if (BindInfo.pObject != nullptr && pResourceImpl == nullptr)
    {
        std::stringstream ss;
        ss << "Failed to bind object '" << BindInfo.pObject->GetDesc().Name << "' to variable '" << GetShaderResourcePrintName(ResDesc, BindInfo.ArrayIndex) << '\'';
        if (SignatureName != nullptr)
        {
            ss << " defined by signature '" << SignatureName << '\'';
        }
        ss << ". Invalid resource type: " << ExpectedResourceTypeName << " is expected.";
        RESOURCE_VALIDATION_FAILURE(ss.str());

        return false;
    }

    if (ResDesc.VarType != SHADER_RESOURCE_VARIABLE_TYPE_DYNAMIC &&
        (BindInfo.Flags & SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE) == 0 &&
        pCachedObject != nullptr && pCachedObject != pResourceImpl)
    {
        const char* VarTypeStr = GetShaderVariableTypeLiteralName(ResDesc.VarType);

        std::stringstream ss;
        ss << "Non-null " << ExpectedResourceTypeName << " '" << pCachedObject->GetDesc().Name << "' is already bound to " << VarTypeStr
           << " shader variable '" << GetShaderResourcePrintName(ResDesc, BindInfo.ArrayIndex) << '\'';
        if (SignatureName != nullptr)
        {
            ss << " defined by signature '" << SignatureName << '\'';
        }
        ss << ". Overwriting the binding with ";
        if (pResourceImpl != nullptr)
        {
            ss << "another resource ('" << pResourceImpl->GetDesc().Name << "')";
        }
        else
        {
            ss << "null";
        }
        ss << " is disallowed by default.";

        if (ResDesc.VarType == SHADER_RESOURCE_VARIABLE_TYPE_STATIC)
        {
            ss << " If this is intended, use the SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE flag. Otherwise,"
               << " label the variable as mutable and use another shader resource binding instance, or label the variable as dynamic.";
        }
        else if (ResDesc.VarType == SHADER_RESOURCE_VARIABLE_TYPE_MUTABLE)
        {
            ss << " If this is intended and you ensured proper synchronization, use the SET_SHADER_RESOURCE_FLAG_ALLOW_OVERWRITE flag. Otherwise,"
               << " use another shader resource binding instance or label the variable as dynamic.";
        }

        RESOURCE_VALIDATION_FAILURE(ss.str());

        return false;
    }

    return true;
}